

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput::DebugOutput(DebugOutput *this,string *s2)

{
  (this->s)._M_dataplus._M_p = (pointer)&(this->s).field_2;
  (this->s)._M_string_length = 0;
  (this->s).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

DebugOutput (std::string s2){s = s2;}